

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void verifyDbFile(unixFile *pFile)

{
  int iVar1;
  long in_RDI;
  long in_FS_OFFSET;
  int rc;
  stat buf;
  uint in_stack_ffffffffffffff58;
  undefined1 local_98 [16];
  ulong local_88;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_98,0xaa,0x90);
  if ((*(ushort *)(in_RDI + 0x1e) & 0x80) == 0) {
    iVar1 = (*aSyscall[5].pCurrent)((ulong)*(uint *)(in_RDI + 0x18),local_98);
    if (iVar1 == 0) {
      if (local_88 == 0) {
        sqlite3_log(0x1c,"file unlinked while open: %s",*(undefined8 *)(in_RDI + 0x38));
      }
      else if (local_88 < 2) {
        iVar1 = fileHasMoved((unixFile *)(ulong)in_stack_ffffffffffffff58);
        if (iVar1 != 0) {
          sqlite3_log(0x1c,"file renamed while open: %s",*(undefined8 *)(in_RDI + 0x38));
        }
      }
      else {
        sqlite3_log(0x1c,"multiple links to file: %s",*(undefined8 *)(in_RDI + 0x38));
      }
    }
    else {
      sqlite3_log(0x1c,"cannot fstat db file %s",*(undefined8 *)(in_RDI + 0x38));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void verifyDbFile(unixFile *pFile){
  struct stat buf;
  int rc;

  /* These verifications occurs for the main database only */
  if( pFile->ctrlFlags & UNIXFILE_NOLOCK ) return;

  rc = osFstat(pFile->h, &buf);
  if( rc!=0 ){
    sqlite3_log(SQLITE_WARNING, "cannot fstat db file %s", pFile->zPath);
    return;
  }
  if( buf.st_nlink==0 ){
    sqlite3_log(SQLITE_WARNING, "file unlinked while open: %s", pFile->zPath);
    return;
  }
  if( buf.st_nlink>1 ){
    sqlite3_log(SQLITE_WARNING, "multiple links to file: %s", pFile->zPath);
    return;
  }
  if( fileHasMoved(pFile) ){
    sqlite3_log(SQLITE_WARNING, "file renamed while open: %s", pFile->zPath);
    return;
  }
}